

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Message __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&>::Elements
          (ElementsAreMatcherImpl<const_std::array<unsigned_long,_5UL>_&> *this,size_t count)

{
  Message *pMVar1;
  char *local_38 [3];
  Message local_20;
  size_t local_18;
  size_t count_local;
  
  local_18 = count;
  count_local = (size_t)this;
  Message::Message(&local_20);
  pMVar1 = Message::operator<<(&local_20,&local_18);
  local_38[0] = " elements";
  if (local_18 == 1) {
    local_38[0] = " element";
  }
  pMVar1 = Message::operator<<(pMVar1,local_38);
  Message::Message((Message *)this,pMVar1);
  Message::~Message(&local_20);
  return (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )this;
}

Assistant:

static Message Elements(size_t count) {
    return Message() << count << (count == 1 ? " element" : " elements");
  }